

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Table * sqlite3LocateTable(Parse *pParse,u32 flags,char *zName,char *zDbase)

{
  int iVar1;
  char *pcVar2;
  Module *local_48;
  Module *pMod;
  char *zMsg;
  Table *p;
  char *zDbase_local;
  char *zName_local;
  u32 flags_local;
  Parse *pParse_local;
  
  iVar1 = sqlite3ReadSchema(pParse);
  if (iVar1 == 0) {
    pParse_local = (Parse *)sqlite3FindTable(pParse->db,zName,zDbase);
    if (pParse_local == (Parse *)0x0) {
      pcVar2 = "no such table";
      if ((flags & 1) != 0) {
        pcVar2 = "no such view";
      }
      iVar1 = sqlite3FindDbName(pParse->db,zDbase);
      if (iVar1 < 1) {
        local_48 = (Module *)sqlite3HashFind(&pParse->db->aModule,zName);
        if ((local_48 == (Module *)0x0) && (iVar1 = sqlite3_strnicmp(zName,"pragma_",7), iVar1 == 0)
           ) {
          local_48 = sqlite3PragmaVtabRegister(pParse->db,zName);
        }
        if ((local_48 != (Module *)0x0) &&
           (iVar1 = sqlite3VtabEponymousTableInit(pParse,local_48), iVar1 != 0)) {
          return local_48->pEpoTab;
        }
      }
      if ((flags & 2) == 0) {
        if (zDbase == (char *)0x0) {
          sqlite3ErrorMsg(pParse,"%s: %s",pcVar2,zName);
        }
        else {
          sqlite3ErrorMsg(pParse,"%s: %s.%s",pcVar2,zDbase,zName);
        }
        pParse->checkSchema = '\x01';
      }
    }
  }
  else {
    pParse_local = (Parse *)0x0;
  }
  return (Table *)pParse_local;
}

Assistant:

SQLITE_PRIVATE Table *sqlite3LocateTable(
  Parse *pParse,         /* context in which to report errors */
  u32 flags,             /* LOCATE_VIEW or LOCATE_NOERR */
  const char *zName,     /* Name of the table we are looking for */
  const char *zDbase     /* Name of the database.  Might be NULL */
){
  Table *p;

  /* Read the database schema. If an error occurs, leave an error message
  ** and code in pParse and return NULL. */
  if( SQLITE_OK!=sqlite3ReadSchema(pParse) ){
    return 0;
  }

  p = sqlite3FindTable(pParse->db, zName, zDbase);
  if( p==0 ){
    const char *zMsg = flags & LOCATE_VIEW ? "no such view" : "no such table";
#ifndef SQLITE_OMIT_VIRTUALTABLE
    if( sqlite3FindDbName(pParse->db, zDbase)<1 ){
      /* If zName is the not the name of a table in the schema created using
      ** CREATE, then check to see if it is the name of an virtual table that
      ** can be an eponymous virtual table. */
      Module *pMod = (Module*)sqlite3HashFind(&pParse->db->aModule, zName);
      if( pMod==0 && sqlite3_strnicmp(zName, "pragma_", 7)==0 ){
        pMod = sqlite3PragmaVtabRegister(pParse->db, zName);
      }
      if( pMod && sqlite3VtabEponymousTableInit(pParse, pMod) ){
        return pMod->pEpoTab;
      }
    }
#endif
    if( (flags & LOCATE_NOERR)==0 ){
      if( zDbase ){
        sqlite3ErrorMsg(pParse, "%s: %s.%s", zMsg, zDbase, zName);
      }else{
        sqlite3ErrorMsg(pParse, "%s: %s", zMsg, zName);
      }
      pParse->checkSchema = 1;
    }
  }

  return p;
}